

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

double ClipperLib::Area(OutPt *op)

{
  double local_28;
  double a;
  OutPt *startOp;
  OutPt *op_local;
  
  if (op == (OutPt *)0x0) {
    op_local = (OutPt *)0x0;
  }
  else {
    local_28 = 0.0;
    startOp = op;
    do {
      local_28 = (double)((startOp->Prev->Pt).X + (startOp->Pt).X) *
                 (double)((startOp->Prev->Pt).Y - (startOp->Pt).Y) + local_28;
      startOp = startOp->Next;
    } while (startOp != op);
    op_local = (OutPt *)(local_28 * 0.5);
  }
  return (double)op_local;
}

Assistant:

double Area(const OutPt *op)
{
  const OutPt *startOp = op;
  if (!op) return 0;
  double a = 0;
  do {
    a +=  (double)(op->Prev->Pt.X + op->Pt.X) * (double)(op->Prev->Pt.Y - op->Pt.Y);
    op = op->Next;
  } while (op != startOp);
  return a * 0.5;
}